

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

void edit_deep_directories(archive_write_disk *a)

{
  int iVar1;
  size_t sVar2;
  long in_RDI;
  bool bVar3;
  char *tail;
  wchar_t ret;
  char *in_stack_000000a0;
  archive_write_disk *in_stack_000000a8;
  char *local_18;
  wchar_t local_c;
  
  local_18 = *(char **)(in_RDI + 0x198);
  sVar2 = strlen(local_18);
  if (0x1000 < sVar2) {
    iVar1 = open(".",0x80000);
    *(int *)(in_RDI + 0x1e8) = iVar1;
    __archive_ensure_cloexec_flag(0);
    if (-1 < *(int *)(in_RDI + 0x1e8)) {
      while (sVar2 = strlen(local_18), 0x1000 < sVar2) {
        local_18 = local_18 + 0xff8;
        while( true ) {
          bVar3 = false;
          if (*(char **)(in_RDI + 0x198) < local_18) {
            bVar3 = *local_18 != '/';
          }
          if (!bVar3) break;
          local_18 = local_18 + -1;
        }
        if (local_18 <= *(char **)(in_RDI + 0x198)) {
          return;
        }
        *local_18 = '\0';
        local_c = create_dir(in_stack_000000a8,in_stack_000000a0);
        if ((local_c == L'\0') && (iVar1 = chdir(*(char **)(in_RDI + 0x198)), iVar1 != 0)) {
          local_c = L'\xffffffe7';
        }
        *local_18 = '/';
        if (local_c != L'\0') {
          return;
        }
        local_18 = local_18 + 1;
        *(char **)(in_RDI + 0x198) = local_18;
      }
    }
  }
  return;
}

Assistant:

static void
edit_deep_directories(struct archive_write_disk *a)
{
	int ret;
	char *tail = a->name;

	/* If path is short, avoid the open() below. */
	if (strlen(tail) <= PATH_MAX)
		return;

	/* Try to record our starting dir. */
	a->restore_pwd = open(".", O_RDONLY | O_BINARY | O_CLOEXEC);
	__archive_ensure_cloexec_flag(a->restore_pwd);
	if (a->restore_pwd < 0)
		return;

	/* As long as the path is too long... */
	while (strlen(tail) > PATH_MAX) {
		/* Locate a dir prefix shorter than PATH_MAX. */
		tail += PATH_MAX - 8;
		while (tail > a->name && *tail != '/')
			tail--;
		/* Exit if we find a too-long path component. */
		if (tail <= a->name)
			return;
		/* Create the intermediate dir and chdir to it. */
		*tail = '\0'; /* Terminate dir portion */
		ret = create_dir(a, a->name);
		if (ret == ARCHIVE_OK && chdir(a->name) != 0)
			ret = ARCHIVE_FAILED;
		*tail = '/'; /* Restore the / we removed. */
		if (ret != ARCHIVE_OK)
			return;
		tail++;
		/* The chdir() succeeded; we've now shortened the path. */
		a->name = tail;
	}
	return;
}